

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O0

Aig_Man_t * Fra_FraigPerform(Aig_Man_t *pManAig,Fra_Par_t *pPars)

{
  int iVar1;
  abctime aVar2;
  Fra_Man_t *p_00;
  Aig_Man_t *pAVar3;
  Fra_Sml_t *pFVar4;
  abctime aVar5;
  abctime aVar6;
  abctime clk2;
  abctime clk;
  Aig_Man_t *pManAigNew;
  Fra_Man_t *p;
  Fra_Par_t *pPars_local;
  Aig_Man_t *pManAig_local;
  
  iVar1 = Aig_ManNodeNum(pManAig);
  if (iVar1 == 0) {
    pManAig_local = Aig_ManDupOrdered(pManAig);
  }
  else {
    aVar2 = Abc_Clock();
    p_00 = Fra_ManStart(pManAig,pPars);
    pAVar3 = Fra_ManPrepareComb(p_00);
    p_00->pManFraig = pAVar3;
    pFVar4 = Fra_SmlStart(pManAig,0,1,pPars->nSimWords);
    p_00->pSml = pFVar4;
    Fra_SmlSimulate(p_00,0);
    iVar1 = Fra_ClassesCountLits(p_00->pCla);
    p_00->nLitsBeg = iVar1;
    iVar1 = Aig_ManNodeNum(pManAig);
    p_00->nNodesBeg = iVar1;
    iVar1 = Aig_ManRegNum(pManAig);
    p_00->nRegsBeg = iVar1;
    if (p_00->pPars->fVerbose != 0) {
      Fra_ClassesPrint(p_00->pCla,1);
    }
    Fra_FraigSweep(p_00);
    if (pManAig->pImpFunc != (_func_void_void_ptr_void_ptr *)0x0) {
      (*pManAig->pImpFunc)(p_00,pManAig->pImpData);
    }
    Fra_ManFinalizeComb(p_00);
    if (p_00->pPars->fChoicing == 0) {
      Fra_ClassesCopyReprs(p_00->pCla,p_00->vTimeouts);
      Aig_ManCleanup(p_00->pManFraig);
      clk = (abctime)p_00->pManFraig;
      p_00->pManFraig = (Aig_Man_t *)0x0;
    }
    else {
      aVar5 = Abc_Clock();
      Fra_ClassesCopyReprs(p_00->pCla,p_00->vTimeouts);
      clk = (abctime)Aig_ManDupRepr(p_00->pManAig,1);
      iVar1 = Aig_ManObjNumMax((Aig_Man_t *)clk);
      Aig_ManReprStart((Aig_Man_t *)clk,iVar1);
      Aig_ManTransferRepr((Aig_Man_t *)clk,p_00->pManAig);
      Aig_ManMarkValidChoices((Aig_Man_t *)clk);
      Aig_ManStop(p_00->pManFraig);
      p_00->pManFraig = (Aig_Man_t *)0x0;
      aVar6 = Abc_Clock();
      p_00->timeTrav = (aVar6 - aVar5) + p_00->timeTrav;
    }
    aVar5 = Abc_Clock();
    p_00->timeTotal = aVar5 - aVar2;
    iVar1 = Fra_ClassesCountLits(p_00->pCla);
    p_00->nLitsEnd = iVar1;
    iVar1 = Aig_ManNodeNum((Aig_Man_t *)clk);
    p_00->nNodesEnd = iVar1;
    iVar1 = Aig_ManRegNum((Aig_Man_t *)clk);
    p_00->nRegsEnd = iVar1;
    Fra_ManStop(p_00);
    pManAig_local = (Aig_Man_t *)clk;
  }
  return pManAig_local;
}

Assistant:

Aig_Man_t * Fra_FraigPerform( Aig_Man_t * pManAig, Fra_Par_t * pPars )
{
    Fra_Man_t * p;
    Aig_Man_t * pManAigNew;
    abctime clk;
    if ( Aig_ManNodeNum(pManAig) == 0 )
        return Aig_ManDupOrdered(pManAig);
clk = Abc_Clock();
    p = Fra_ManStart( pManAig, pPars );
    p->pManFraig = Fra_ManPrepareComb( p );
    p->pSml = Fra_SmlStart( pManAig, 0, 1, pPars->nSimWords );
    Fra_SmlSimulate( p, 0 );
//    if ( p->pPars->fChoicing )
//        Aig_ManReprStart( p->pManFraig, Aig_ManObjNumMax(p->pManAig) );
    // collect initial states
    p->nLitsBeg  = Fra_ClassesCountLits( p->pCla );
    p->nNodesBeg = Aig_ManNodeNum(pManAig);
    p->nRegsBeg  = Aig_ManRegNum(pManAig);
    // perform fraig sweep
if ( p->pPars->fVerbose )
Fra_ClassesPrint( p->pCla, 1 );
    Fra_FraigSweep( p );
    // call back the procedure to check implications
    if ( pManAig->pImpFunc )
        pManAig->pImpFunc( p, pManAig->pImpData );
    // no need to filter one-hot clauses because they satisfy base case by construction
    // finalize the fraiged manager
    Fra_ManFinalizeComb( p );
    if ( p->pPars->fChoicing )
    { 
abctime clk2 = Abc_Clock();
        Fra_ClassesCopyReprs( p->pCla, p->vTimeouts );
        pManAigNew = Aig_ManDupRepr( p->pManAig, 1 );
        Aig_ManReprStart( pManAigNew, Aig_ManObjNumMax(pManAigNew) );
        Aig_ManTransferRepr( pManAigNew, p->pManAig );
        Aig_ManMarkValidChoices( pManAigNew );
        Aig_ManStop( p->pManFraig );
        p->pManFraig = NULL;
p->timeTrav += Abc_Clock() - clk2;
    }
    else
    {
        Fra_ClassesCopyReprs( p->pCla, p->vTimeouts );
        Aig_ManCleanup( p->pManFraig );
        pManAigNew = p->pManFraig;
        p->pManFraig = NULL;
    }
p->timeTotal = Abc_Clock() - clk;
    // collect final stats
    p->nLitsEnd  = Fra_ClassesCountLits( p->pCla );
    p->nNodesEnd = Aig_ManNodeNum(pManAigNew);
    p->nRegsEnd  = Aig_ManRegNum(pManAigNew);
    Fra_ManStop( p );
    return pManAigNew;
}